

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int default_emit_certificate_cb
              (ptls_emit_certificate_t *_self,ptls_t *tls,ptls_message_emitter_t *emitter,
              ptls_key_schedule_t *key_sched,ptls_iovec_t context,int push_status_request)

{
  ptls_buffer_t *buf;
  size_t sVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  ptls_hash_context_t **pppVar8;
  
  iVar5 = (*emitter->begin_message)(emitter);
  if (iVar5 == 0) {
    buf = emitter->buf;
    sVar1 = buf->off;
    iVar5 = ptls_buffer_reserve(buf,1);
    if (iVar5 == 0) {
      buf->base[buf->off] = '\v';
      buf->off = buf->off + 1;
      iVar5 = ptls_buffer_reserve(buf,3);
      if (iVar5 == 0) {
        puVar2 = buf->base;
        sVar3 = buf->off;
        puVar2[sVar3 + 2] = '\0';
        puVar2 = puVar2 + sVar3;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        sVar7 = buf->off;
        sVar3 = sVar7 + 3;
        buf->off = sVar3;
        iVar5 = ptls_build_certificate_message
                          (emitter->buf,context,(tls->ctx->certificates).list,
                           (tls->ctx->certificates).count,(ptls_iovec_t)ZEXT816(0));
        if (iVar5 == 0) {
          sVar4 = buf->off;
          lVar6 = 0x10;
          do {
            buf->base[sVar7] = (uint8_t)(sVar4 - sVar3 >> ((byte)lVar6 & 0x3f));
            lVar6 = lVar6 + -8;
            sVar7 = sVar7 + 1;
          } while (lVar6 != -8);
          if ((key_sched != (ptls_key_schedule_t *)0x0) && (key_sched->num_hashes != 0)) {
            puVar2 = buf->base;
            sVar3 = buf->off;
            pppVar8 = &key_sched->hashes[0].ctx;
            sVar7 = 0;
            do {
              (*(*pppVar8)->update)(*pppVar8,puVar2 + sVar1,sVar3 - sVar1);
              sVar7 = sVar7 + 1;
              pppVar8 = pppVar8 + 2;
            } while (sVar7 != key_sched->num_hashes);
          }
          iVar5 = (*emitter->commit_message)(emitter);
          return iVar5;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int default_emit_certificate_cb(ptls_emit_certificate_t *_self, ptls_t *tls, ptls_message_emitter_t *emitter,
                                       ptls_key_schedule_t *key_sched, ptls_iovec_t context, int push_status_request)
{
    int ret;

    ptls_push_message(emitter, key_sched, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
        if ((ret = ptls_build_certificate_message(emitter->buf, context, tls->ctx->certificates.list, tls->ctx->certificates.count,
                                                  ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    });

    ret = 0;
Exit:
    return ret;
}